

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O0

ssize_t __thiscall BOCC_CTA::write(BOCC_CTA *this,int __fd,void *__buf,size_t __n)

{
  value_type pDVar1;
  mapped_type *ppTVar2;
  reference ppDVar3;
  size_t __n_00;
  int __fd_00;
  int value_local;
  int dIdx_local;
  int tid_local;
  BOCC_CTA *this_local;
  
  __fd_00 = (int)__buf;
  __n_00 = __n;
  value_local = __fd;
  _dIdx_local = this;
  std::shared_mutex::lock_shared(&this->scheduler_lock);
  ppTVar2 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&value_local);
  Transaction::write(*ppTVar2,__fd_00,(void *)(__n & 0xffffffff),__n_00);
  ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                      (&this->dataItems,(long)__fd_00);
  std::mutex::lock(&(*ppDVar3)->lock);
  ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                      (&this->dataItems,(long)__fd_00);
  pDVar1 = *ppDVar3;
  ppTVar2 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&value_local);
  std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::insert
            (&pDVar1->read_list,ppTVar2);
  ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                      (&this->dataItems,(long)__fd_00);
  std::mutex::unlock(&(*ppDVar3)->lock);
  std::shared_mutex::unlock_shared(&this->scheduler_lock);
  return 0;
}

Assistant:

int BOCC_CTA::write(int tid, int dIdx, const int value) {
    scheduler_lock.lock_shared();
    transactions[tid]->write(dIdx, value);
    dataItems[dIdx]->lock.lock();

    dataItems[dIdx]->read_list.insert(transactions[tid]);

    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();
    return 0;
}